

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
::jls_codec(jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
            *this,default_traits<unsigned_char,_charls::triplet<unsigned_char>_> traits,
           frame_info *frame_info,coding_parameters *parameters)

{
  undefined4 uVar1;
  undefined4 uVar2;
  default_traits<unsigned_char,_charls::triplet<unsigned_char>_> dVar3;
  frame_info *pfVar4;
  bool bVar5;
  frame_info frame;
  frame_info local_30;
  coding_parameters *local_20;
  coding_parameters *parameters_local;
  frame_info *frame_info_local;
  jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
  *this_local;
  
  dVar3 = traits;
  uVar1 = frame_info->bits_per_sample;
  uVar2 = frame_info->component_count;
  frame.height = uVar2;
  frame.width = uVar1;
  frame._8_8_ = parameters;
  local_20 = parameters;
  parameters_local = (coding_parameters *)frame_info;
  frame_info_local = (frame_info *)this;
  local_30 = update_component_count
                       (*(jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
                          **)frame_info,frame,
                        (coding_parameters *)
                        *(jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
                          **)frame_info);
  decoder_strategy::decoder_strategy(&this->super_decoder_strategy,&local_30,local_20);
  (this->super_decoder_strategy)._vptr_decoder_strategy = (_func_int **)&PTR__jls_codec_001758d0;
  (this->traits_).maximum_sample_value = traits.maximum_sample_value;
  (this->traits_).near_lossless = traits.near_lossless;
  traits._8_8_ = dVar3._8_8_;
  (this->traits_).range = traits.range;
  (this->traits_).quantized_bits_per_pixel = traits.quantized_bits_per_pixel;
  traits._16_8_ = dVar3._16_8_;
  (this->traits_).bits_per_pixel = traits.bits_per_pixel;
  (this->traits_).limit = traits.limit;
  traits.reset_threshold = dVar3.reset_threshold;
  (this->traits_).reset_threshold = traits.reset_threshold;
  (this->rect_).X = 0;
  (this->rect_).Y = 0;
  (this->rect_).Width = 0;
  (this->rect_).Height = 0;
  this->width_ = parameters_local->near_lossless;
  this->t1_ = 0;
  this->t2_ = 0;
  this->t3_ = 0;
  this->reset_threshold_ = '\0';
  this->restart_interval_ = 0;
  this->restart_interval_counter_ = 0;
  std::array<charls::context_regular_mode,_365UL>::array(&this->contexts_);
  std::array<charls::context_run_mode,_2UL>::array(&this->context_run_mode_);
  this->run_index_ = 0;
  this->previous_line_ = (pixel_type *)0x0;
  this->current_line_ = (pixel_type *)0x0;
  this->quantization_ = (int8_t *)0x0;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector(&this->quantization_lut_);
  if (local_20->interleave_mode == None) {
    pfVar4 = jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
             ::frame_info(this);
    bVar5 = true;
    if (pfVar4->component_count == 1) goto LAB_00129fe4;
  }
  bVar5 = local_20->interleave_mode != None;
LAB_00129fe4:
  if (!bVar5) {
    __assert_fail("(parameters.interleave_mode == interleave_mode::none && this->frame_info().component_count == 1) || parameters.interleave_mode != interleave_mode::none"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                  ,0x6b,
                  "charls::jls_codec<charls::default_traits<unsigned char, charls::triplet<unsigned char>>, charls::decoder_strategy>::jls_codec(Traits, const frame_info &, const coding_parameters &) [Traits = charls::default_traits<unsigned char, charls::triplet<unsigned char>>, Strategy = charls::decoder_strategy]"
                 );
  }
  bVar5 = default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::is_valid(&this->traits_);
  if (!bVar5) {
    __assert_fail("traits_.is_valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                  ,0x6c,
                  "charls::jls_codec<charls::default_traits<unsigned char, charls::triplet<unsigned char>>, charls::decoder_strategy>::jls_codec(Traits, const frame_info &, const coding_parameters &) [Traits = charls::default_traits<unsigned char, charls::triplet<unsigned char>>, Strategy = charls::decoder_strategy]"
                 );
  }
  return;
}

Assistant:

jls_codec(Traits traits, const frame_info& frame_info, const coding_parameters& parameters) noexcept :
        Strategy{update_component_count(frame_info, parameters), parameters},
        traits_{std::move(traits)},
        width_{frame_info.width}
    {
        ASSERT((parameters.interleave_mode == interleave_mode::none && this->frame_info().component_count == 1) ||
               parameters.interleave_mode != interleave_mode::none);
        ASSERT(traits_.is_valid());
    }